

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall
util::exception::exception<char_const(&)[20],CylHead&,char_const(&)[15],int&>
          (exception *this,char (*args) [20],CylHead *args_1,char (*args_2) [15],int *args_3)

{
  int *in_R9;
  string local_50;
  int *local_30;
  int *args_local_3;
  char (*args_local_2) [15];
  CylHead *args_local_1;
  char (*args_local) [20];
  exception *this_local;
  
  local_30 = args_3;
  args_local_3 = (int *)args_2;
  args_local_2 = (char (*) [15])args_1;
  args_local_1 = (CylHead *)args;
  args_local = (char (*) [20])this;
  make_string<char_const(&)[20],CylHead&,char_const(&)[15],int&>
            (&local_50,(util *)args,(char (*) [20])args_1,(CylHead *)args_2,(char (*) [15])args_3,
             in_R9);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)this = &PTR__exception_00301e18;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}